

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

int sysbvm_type_computeDepth(sysbvm_tuple_t type)

{
  int iVar1;
  
  iVar1 = -1;
  while (type != 0) {
    if (((type & 0xf) == 0) && ((*(byte *)(type + 8) & 0x80) == 0)) {
      type = *(ulong *)(type + 0x30);
    }
    else {
      type = 0;
    }
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

SYSBVM_API int sysbvm_type_computeDepth(sysbvm_tuple_t type)
{
    if(!type)
        return -1;

    return sysbvm_type_computeDepth(sysbvm_type_getSupertype(type)) + 1;
}